

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O3

void bk_lib::detail::fill<Clasp::SolverStats*>
               (SolverStats **first,SolverStats **last,SolverStats **x)

{
  SolverStats *pSVar1;
  
  switch((uint)((int)last - (int)first) >> 3 & 7) {
  case 0:
    for (; first != last; first = first + 1) {
      pSVar1 = *x;
      *first = pSVar1;
      first = first + 1;
LAB_0011d9b6:
      *first = pSVar1;
      first = first + 1;
switchD_0011d991_caseD_6:
      pSVar1 = *x;
      *first = pSVar1;
      first = first + 1;
LAB_0011d9c7:
      *first = pSVar1;
      first = first + 1;
switchD_0011d991_caseD_4:
      pSVar1 = *x;
      *first = pSVar1;
      first = first + 1;
LAB_0011d9d8:
      *first = pSVar1;
      first = first + 1;
switchD_0011d991_caseD_2:
      pSVar1 = *x;
      *first = pSVar1;
      first = first + 1;
LAB_0011d9e9:
      *first = pSVar1;
    }
    break;
  case 1:
    pSVar1 = *x;
    goto LAB_0011d9e9;
  case 2:
    goto switchD_0011d991_caseD_2;
  case 3:
    pSVar1 = *x;
    goto LAB_0011d9d8;
  case 4:
    goto switchD_0011d991_caseD_4;
  case 5:
    pSVar1 = *x;
    goto LAB_0011d9c7;
  case 6:
    goto switchD_0011d991_caseD_6;
  case 7:
    pSVar1 = *x;
    goto LAB_0011d9b6;
  }
  return;
}

Assistant:

void fill(T* first, T* last, const T& x) {
		assert(first <= last);
		switch ((last - first) & 7u)
		{
		case 0:
				while (first != last)
				{
				new(first++) T(x);
		case 7: new(first++) T(x);
		case 6: new(first++) T(x);
		case 5: new(first++) T(x);
		case 4: new(first++) T(x);
		case 3: new(first++) T(x);
		case 2: new(first++) T(x);
		case 1: new(first++) T(x);
				assert(first <= last);
				}
		}
	}